

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O1

char * ssh_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,Conf *conf,
               char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  bufchain *ch;
  _Bool _Var1;
  int iVar2;
  Ssh *ssh;
  Conf *pCVar3;
  char *pcVar4;
  Socket *pSVar5;
  SockAddr *addr;
  BinaryPacketProtocol *pBVar6;
  char *protoversion;
  char *loghost;
  
  ssh = (Ssh *)safemalloc(1,0x200,0);
  memset(ssh,0,0x200);
  pCVar3 = conf_copy(conf);
  ssh->conf = pCVar3;
  ssh_cache_conf_values(ssh);
  ssh->exitcode = -1;
  (ssh->pls).kctx = SSH2_PKTCTX_NOKEX;
  (ssh->pls).actx = SSH2_PKTCTX_NOAUTH;
  bufchain_init(&ssh->in_raw);
  ch = &ssh->out_raw;
  bufchain_init(ch);
  bufchain_init(&ssh->user_input);
  (ssh->ic_out_raw).fn = ssh_bpp_output_raw_data_callback;
  (ssh->ic_out_raw).ctx = ssh;
  iVar2 = conf_get_int(ssh->conf,0x7d);
  ssh->term_width = iVar2;
  iVar2 = conf_get_int(ssh->conf,0x7e);
  ssh->term_height = iVar2;
  (ssh->backend).vt = vt;
  (ssh->interactor).vt = &Ssh_interactorvt;
  (ssh->backend).interactor = &ssh->interactor;
  *backend_handle = &ssh->backend;
  ssh->bare_connection = vt->protocol == 4;
  ssh->seat = seat;
  (ssh->cl_dummy).vt = &dummy_connlayer_vtable;
  ssh->logctx = logctx;
  (ssh->cl_dummy).logctx = logctx;
  ssh_hostport_setup(host,port,ssh->conf,&ssh->savedhost,&ssh->savedport,&loghost);
  pcVar4 = default_description(vt,ssh->savedhost,ssh->savedport);
  ssh->description = pcVar4;
  random_ref();
  ssh->need_random_unref = true;
  (ssh->plug).vt = &Ssh_plugvt;
  ssh->connshare = (ssh_sharing_state *)0x0;
  ssh->attempting_connshare = true;
  pSVar5 = ssh_connection_sharing_init
                     (ssh->savedhost,ssh->savedport,ssh->conf,ssh->logctx,&ssh->plug,&ssh->connshare
                     );
  ssh->s = pSVar5;
  if (ssh->connshare != (ssh_sharing_state *)0x0) {
    ssh_connshare_provide_connlayer(ssh->connshare,&ssh->cl_dummy);
  }
  ssh->attempting_connshare = false;
  if (ssh->s == (Socket *)0x0) {
    iVar2 = conf_get_int(ssh->conf,3);
    addr = name_lookup(host,port,realhost,ssh->conf,iVar2,ssh->logctx,"SSH connection");
    pcVar4 = sk_addr_error(addr);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = dupstr(*realhost);
      ssh->fullhostname = pcVar4;
      pSVar5 = new_connection(addr,*realhost,port,false,true,nodelay,keepalive,&ssh->plug,ssh->conf,
                              &ssh->interactor);
      ssh->s = pSVar5;
      pcVar4 = (*pSVar5->vt->socket_error)(pSVar5);
      if (pcVar4 == (char *)0x0) goto LAB_00116ec8;
      ssh->s = (Socket *)0x0;
      (*ssh->seat->vt->notify_remote_exit)(ssh->seat);
      (*ssh->seat->vt->notify_remote_disconnect)(ssh->seat);
    }
    else {
      sk_addr_free(addr);
    }
    pcVar4 = dupstr(pcVar4);
    goto LAB_001170f5;
  }
  ssh->bare_connection = true;
  ssh->fullhostname = (char *)0x0;
  pcVar4 = dupstr(host);
  *realhost = pcVar4;
  _Var1 = (*ssh->seat->vt->verbose)(ssh->seat);
  if (_Var1) {
LAB_00116eae:
    (*ssh->seat->vt->output)
              (ssh->seat,SEAT_OUTPUT_STDERR,"Reusing a shared connection to this server.\r\n",0x2d);
  }
  else {
    _Var1 = (*ssh->seat->vt->interactive)(ssh->seat);
    if (_Var1) goto LAB_00116eae;
  }
LAB_00116ec8:
  iVar2 = conf_get_int(ssh->conf,0x23);
  if (iVar2 == 0) {
    ssh->version = 1;
    if (ssh->bare_connection == true) goto LAB_00116f7c;
  }
  else {
    if (iVar2 != 3) {
      __assert_fail("sshprot == 0 || sshprot == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/ssh.c",
                    0x346,
                    "char *connect_to_host(Ssh *, const char *, int, char *, char **, _Bool, _Bool)"
                   );
    }
LAB_00116f7c:
    ssh->version = 2;
  }
  (ssh->version_receiver).got_ssh_version = ssh_got_ssh_version;
  protoversion = "2.0";
  if (ssh->version == 1) {
    protoversion = "1.5";
  }
  pcVar4 = (char *)0x0;
  pBVar6 = ssh_verstring_new(ssh->conf,ssh->logctx,ssh->bare_connection,protoversion,
                             &ssh->version_receiver,false,"PuTTY");
  ssh->bpp = pBVar6;
  pBVar6->ssh = ssh;
  pBVar6->in_raw = &ssh->in_raw;
  pBVar6->out_raw = ch;
  bufchain_set_callback_inner(ch,&ssh->ic_out_raw,queue_idempotent_callback);
  pBVar6 = ssh->bpp;
  pBVar6->pls = &ssh->pls;
  pBVar6->logctx = ssh->logctx;
  pBVar6->remote_bugs = ssh->remote_bugs;
  queue_idempotent_callback(&pBVar6->ic_in_raw);
  if (*loghost != '\0') {
    safefree(*realhost);
    pcVar4 = dupstr(loghost);
    *realhost = pcVar4;
    pcVar4 = (char *)0x0;
  }
LAB_001170f5:
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    ssh->need_random_unref = false;
    random_unref();
  }
  return pcVar4;
}

Assistant:

static char *ssh_init(const BackendVtable *vt, Seat *seat,
                      Backend **backend_handle, LogContext *logctx,
                      Conf *conf, const char *host, int port,
                      char **realhost, bool nodelay, bool keepalive)
{
    Ssh *ssh;

    ssh = snew(Ssh);
    memset(ssh, 0, sizeof(Ssh));

    ssh->conf = conf_copy(conf);
    ssh_cache_conf_values(ssh);
    ssh->exitcode = -1;
    ssh->pls.kctx = SSH2_PKTCTX_NOKEX;
    ssh->pls.actx = SSH2_PKTCTX_NOAUTH;
    bufchain_init(&ssh->in_raw);
    bufchain_init(&ssh->out_raw);
    bufchain_init(&ssh->user_input);
    ssh->ic_out_raw.fn = ssh_bpp_output_raw_data_callback;
    ssh->ic_out_raw.ctx = ssh;

    ssh->term_width = conf_get_int(ssh->conf, CONF_width);
    ssh->term_height = conf_get_int(ssh->conf, CONF_height);

    ssh->backend.vt = vt;
    ssh->interactor.vt = &Ssh_interactorvt;
    ssh->backend.interactor = &ssh->interactor;
    *backend_handle = &ssh->backend;

    ssh->bare_connection = (vt->protocol == PROT_SSHCONN);

    ssh->seat = seat;
    ssh->cl_dummy.vt = &dummy_connlayer_vtable;
    ssh->cl_dummy.logctx = ssh->logctx = logctx;

    char *loghost;

    ssh_hostport_setup(host, port, ssh->conf,
                       &ssh->savedhost, &ssh->savedport, &loghost);
    ssh->description = default_description(vt, ssh->savedhost, ssh->savedport);

    random_ref(); /* do this now - may be needed by sharing setup code */
    ssh->need_random_unref = true;

    char *conn_err = connect_to_host(
        ssh, host, port, loghost, realhost, nodelay, keepalive);
    if (conn_err) {
        /* Call random_unref now instead of waiting until the caller
         * frees this useless Ssh object, in case the caller is
         * impatient and just exits without bothering, in which case
         * the random seed won't be re-saved. */
        ssh->need_random_unref = false;
        random_unref();
        return conn_err;
    }

    return NULL;
}